

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* cinatra::split_sv(string_view s,string_view delimiter)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  size_t end;
  size_t start;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *output;
  size_type in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__pos;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  undefined8 local_38;
  
  bVar1._M_str = (char *)in_RDI;
  bVar1._M_len = in_stack_ffffffffffffff68;
  __pos = in_RDI;
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                       (in_stack_ffffffffffffff60,bVar1,in_stack_ffffffffffffff58);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x182f3e);
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffff80,(size_type)__pos,(size_type)in_RDI);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)bVar1._M_len);
    if (local_38 == 0xffffffffffffffff) break;
    __str._M_str = (char *)in_RDI;
    __str._M_len = bVar1._M_len;
    in_stack_ffffffffffffff80 = in_RCX;
    local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)bVar1._M_str,__str,
                          in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

inline std::vector<std::string_view> split_sv(std::string_view s,
                                              std::string_view delimiter) {
  size_t start = 0;
  size_t end = s.find_first_of(delimiter);

  std::vector<std::string_view> output;

  while (end <= std::string_view::npos) {
    output.emplace_back(s.substr(start, end - start));

    if (end == std::string_view::npos)
      break;

    start = end + 1;
    end = s.find_first_of(delimiter, start);
  }

  return output;
}